

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::ClassNameWorker_abi_cxx11_(Descriptor *descriptor)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Descriptor *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string name;
  string local_60 [48];
  string local_30 [24];
  Descriptor *in_stack_ffffffffffffffe8;
  
  std::__cxx11::string::string(local_30);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Descriptor::containing_type(in_RSI);
  if (__lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    Descriptor::containing_type(in_RSI);
    ClassNameWorker_abi_cxx11_(in_stack_ffffffffffffffe8);
    std::__cxx11::string::operator=(local_30,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::operator+=(local_30,"_");
  }
  Descriptor::name_abi_cxx11_(in_RSI);
  std::operator+(__lhs,in_RDI);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string ClassNameWorker(const Descriptor* descriptor) {
  string name;
  if (descriptor->containing_type() != NULL) {
    name = ClassNameWorker(descriptor->containing_type());
    name += "_";
  }
  return name + descriptor->name();
}